

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1FreePage(PgHdr1 *p)

{
  PCache1 *pPVar1;
  PCache1 *pCache;
  PgHdr1 *p_local;
  
  pPVar1 = p->pCache;
  if (p->isBulkLocal == 0) {
    pcache1Free((p->page).pBuf);
  }
  else {
    p->pNext = pPVar1->pFree;
    pPVar1->pFree = p;
  }
  *pPVar1->pnPurgeable = *pPVar1->pnPurgeable - 1;
  return;
}

Assistant:

static void pcache1FreePage(PgHdr1 *p){
  PCache1 *pCache;
  assert( p!=0 );
  pCache = p->pCache;
  assert( sqlite3_mutex_held(p->pCache->pGroup->mutex) );
  if( p->isBulkLocal ){
    p->pNext = pCache->pFree;
    pCache->pFree = p;
  }else{
    pcache1Free(p->page.pBuf);
  }
  (*pCache->pnPurgeable)--;
}